

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void mpickup_obj(monst *mtmp,obj *otmp)

{
  permonst *ppVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (otmp->otyp == 0x214) {
    ppVar1 = mtmp->data;
    if (((ppVar1 == mons + 0x145 ||
         (ppVar1 == mons + 0x146 || (ppVar1 == mons + 0x144 || ppVar1 == mons + 0x11b))) ||
         ppVar1->msound == '\x1f') && ((mtmp->field_0x62 & 0x40) == 0)) {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        pline("A thunderclap rings out!");
      }
      else {
        iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (iVar2 < 6) {
          pcVar4 = doname(otmp);
        }
        else {
          pcVar4 = distant_name(otmp,doname);
        }
        pline("A thunderclap rings out, and %s shatters!",pcVar4);
        pcVar4 = Monnam(mtmp);
        pline("%s strides through the dust cloud.",pcVar4);
      }
      goto LAB_001e8e0d;
    }
  }
  if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (flags.verbose != '\0')) {
    pcVar4 = Monnam(mtmp);
    iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
    if (iVar2 < 6) {
      pcVar3 = doname(otmp);
    }
    else {
      pcVar3 = distant_name(otmp,doname);
    }
    pline("%s picks up %s.",pcVar4,pcVar3);
  }
LAB_001e8e0d:
  if (((otmp->otyp == 0x214) &&
      (ppVar1 = mtmp->data,
      (ppVar1 == mons + 0x145 ||
      (ppVar1 == mons + 0x146 || (ppVar1 == mons + 0x144 || ppVar1 == mons + 0x11b))) ||
      ppVar1->msound == '\x1f')) && ((mtmp->field_0x62 & 0x40) == 0)) {
    remove_object(otmp);
  }
  else {
    obj_extract_self(otmp);
    mpickobj(mtmp,otmp);
  }
  m_dowear(level,mtmp,'\0');
  newsym((int)mtmp->mx,(int)mtmp->my);
  return;
}

Assistant:

void mpickup_obj(struct monst *mtmp, struct obj *otmp)
{
	if (otmp->otyp == BOULDER && is_rockbreaker(mtmp)) {
	    if (cansee(mtmp->mx,mtmp->my)) {
		pline("A thunderclap rings out, and %s shatters!",
		      (distu(mtmp->mx, mtmp->my) <= 5) ?
		      doname(otmp) : distant_name(otmp, doname));
		pline("%s strides through the dust cloud.", Monnam(mtmp));
	    } else {
		pline("A thunderclap rings out!");
	    }
	} else {
	    if (cansee(mtmp->mx,mtmp->my) && flags.verbose) {
		pline("%s picks up %s.", Monnam(mtmp),
		      (distu(mtmp->mx, mtmp->my) <= 5) ?
		      doname(otmp) : distant_name(otmp, doname));
	    }
	}
	if (otmp->otyp == BOULDER && is_rockbreaker(mtmp)) {
	    remove_object(otmp);
	} else {
	    obj_extract_self(otmp);
	    mpickobj(mtmp, otmp);	/* may merge and free otmp */
	}
	m_dowear(level, mtmp, FALSE);
	newsym(mtmp->mx, mtmp->my);
}